

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acec2Mult.c
# Opt level: O1

int Sdb_StoDiffExactlyOne3(Vec_Wec_t *vCuts,int Limit,int *pCut,int *pCount)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  if ((long)vCuts->nSize < 1) {
    iVar7 = 0;
    iVar3 = -1;
  }
  else {
    iVar3 = -1;
    uVar8 = 0;
    iVar7 = 0;
    do {
      if (uVar8 != (uint)Limit) {
        uVar1 = *pCut;
        if ((int)uVar1 < 1) {
          iVar6 = -1;
          uVar10 = 1;
        }
        else {
          uVar2 = vCuts->pArray[uVar8].nSize;
          uVar10 = (ulong)uVar1 + 1;
          uVar9 = 1;
          iVar5 = -1;
          do {
            if (0 < (int)uVar2) {
              uVar4 = 0;
              do {
                iVar6 = iVar5;
                if (vCuts->pArray[uVar8].pArray[uVar4] == pCut[uVar9]) goto LAB_00681b91;
                uVar4 = uVar4 + 1;
              } while (uVar2 != uVar4);
            }
            iVar6 = pCut[uVar9];
            if (iVar5 != -1) {
              uVar10 = uVar9 & 0xffffffff;
              iVar6 = iVar5;
              break;
            }
LAB_00681b91:
            uVar9 = uVar9 + 1;
            iVar5 = iVar6;
          } while (uVar9 != uVar10);
        }
        if (((int)uVar10 == uVar1 + 1) && (iVar6 != -1)) {
          if (iVar3 == -1) {
            iVar3 = iVar6;
          }
          iVar7 = iVar7 + (uint)(iVar3 == iVar6);
        }
      }
    } while ((uVar8 != (uint)Limit) && (uVar8 = uVar8 + 1, uVar8 != (long)vCuts->nSize));
  }
  *pCount = iVar7;
  return iVar3;
}

Assistant:

int Sdb_StoDiffExactlyOne3( Vec_Wec_t * vCuts, int Limit, int * pCut, int * pCount )
{
    Vec_Int_t * vCut;  
    int i, iNewAll = -1, Count = 0;
    Vec_WecForEachLevel( vCuts, vCut, i )
    {
        int k, iNew = -1;
        if ( i == Limit )
            break;
        for ( k = 1; k <= pCut[0]; k++ )
        {
            if ( Vec_IntFind(vCut, pCut[k]) >= 0 )
                continue;
            if ( iNew == -1 )
                iNew = pCut[k];
            else 
                break;
        }
        if ( k == pCut[0] + 1 && iNew != -1 )
        {
            if ( iNewAll == -1 )
                iNewAll = iNew;
            if ( iNewAll == iNew )
                Count++;
        }
    }
    *pCount = Count;
    return iNewAll;
}